

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Television.cpp
# Opt level: O2

void __thiscall L15_1::Television::settings(Television *this)

{
  std::operator<<((ostream *)&std::cout,"TV is ");
}

Assistant:

void Television::settings() const {
        std::cout << "TV is " << (_state == On ? "On" : "Off") << std::endl;
        if (_state == On) {
            std::cout << "Volume setting = " << _volume << std::endl;
            std::cout << "Channel setting = " << _channel << std::endl;
            std::cout << "Mode = " << (_mode == Antenna ? "Antenna" : "Cable") << std::endl;
            std::cout << "Input = " << (_input == TV ? "TV" : "DVD") << std::endl;
        }
    }